

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void substring_to_example(vw *all,example *ae,substring example)

{
  substring *psVar1;
  parser *ppVar2;
  char *max;
  char *pcVar3;
  char *max_00;
  char *start;
  char *pcVar4;
  substring s;
  TC_parser<true> parser_line;
  
  max_00 = example.end;
  start = example.begin;
  (*(all->p->lp).default_label)(&ae->l);
  max = safe_index(start,'|',max_00);
  pcVar3 = safe_index(start,'\t',max);
  if (*start == '|') {
    v_array<substring>::clear(&all->p->words);
  }
  else {
    pcVar4 = pcVar3 + 1;
    if (pcVar3 == max) {
      pcVar4 = start;
    }
    s.end = max;
    s.begin = pcVar4;
    tokenize<v_array<substring>>(' ',s,&all->p->words,false);
    ppVar2 = all->p;
    psVar1 = (ppVar2->words)._end;
    if ((psVar1 != (ppVar2->words)._begin) &&
       ((psVar1[-1].end == max || (*psVar1[-1].begin == '\'')))) {
      (ppVar2->words)._end = psVar1 + -1;
      pcVar3 = psVar1[-1].begin + (*psVar1[-1].begin == '\'');
      push_many<char>(&ae->tag,pcVar3,(long)psVar1[-1].end - (long)pcVar3);
    }
  }
  ppVar2 = all->p;
  if ((ppVar2->words)._end != (ppVar2->words)._begin) {
    (*(ppVar2->lp).parse_label)(ppVar2,all->sd,&ae->l,&ppVar2->words);
  }
  if ((all->audit == false) && (all->hash_inv != true)) {
    TC_parser<false>::TC_parser((TC_parser<false> *)&parser_line,max,max_00,all,ae);
  }
  else {
    TC_parser<true>::TC_parser(&parser_line,max,max_00,all,ae);
  }
  return;
}

Assistant:

void substring_to_example(vw* all, example* ae, substring example)
{
  all->p->lp.default_label(&ae->l);
  char* bar_location = safe_index(example.begin, '|', example.end);
  char* tab_location = safe_index(example.begin, '\t', bar_location);
  substring label_space;
  if (tab_location != bar_location)
  {
    label_space.begin = tab_location + 1;
  }
  else
  {
    label_space.begin = example.begin;
  }
  label_space.end = bar_location;

  if (*example.begin == '|')
  {
    all->p->words.clear();
  }
  else
  {
    tokenize(' ', label_space, all->p->words);
    if (all->p->words.size() > 0 &&
        (all->p->words.last().end == label_space.end ||
            *(all->p->words.last().begin) == '\''))  // The last field is a tag, so record and strip it off
    {
      substring tag = all->p->words.pop();
      if (*tag.begin == '\'')
        tag.begin++;
      push_many(ae->tag, tag.begin, tag.end - tag.begin);
    }
  }

  if (all->p->words.size() > 0)
    all->p->lp.parse_label(all->p, all->sd, &ae->l, all->p->words);

  if (all->audit || all->hash_inv)
    TC_parser<true> parser_line(bar_location, example.end, *all, ae);
  else
    TC_parser<false> parser_line(bar_location, example.end, *all, ae);
}